

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringExtras.cpp
# Opt level: O2

void __thiscall llvm::printEscapedString(llvm *this,StringRef Name,raw_ostream *Out)

{
  byte bVar1;
  raw_ostream *prVar2;
  char cVar3;
  uchar UC;
  size_t Index;
  StringRef Name_local;
  
  Name_local.Length = (size_t)Name.Data;
  Name_local.Data = (char *)this;
  for (Index = 0; (uint)Name.Data != Index; Index = Index + 1) {
    bVar1 = StringRef::operator[](&Name_local,Index);
    if ((((byte)(bVar1 - 0x20) < 0x5f) && (bVar1 != 0x22)) && (bVar1 != 0x5c)) {
      raw_ostream::operator<<((raw_ostream *)Name.Length,bVar1);
    }
    else {
      prVar2 = raw_ostream::operator<<((raw_ostream *)Name.Length,'\\');
      cVar3 = (bVar1 >> 4) + 0x37;
      if (bVar1 < 0xa0) {
        cVar3 = (bVar1 >> 4) + 0x30;
      }
      prVar2 = raw_ostream::operator<<(prVar2,cVar3);
      bVar1 = bVar1 & 0xf;
      cVar3 = bVar1 + 0x37;
      if (bVar1 < 10) {
        cVar3 = bVar1 + 0x30;
      }
      raw_ostream::operator<<(prVar2,cVar3);
    }
  }
  return;
}

Assistant:

void llvm::printEscapedString(StringRef Name, raw_ostream &Out) {
  for (unsigned i = 0, e = Name.size(); i != e; ++i) {
    unsigned char C = Name[i];
    if (isPrint(C) && C != '\\' && C != '"')
      Out << C;
    else
      Out << '\\' << hexdigit(C >> 4) << hexdigit(C & 0x0F);
  }
}